

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.cpp
# Opt level: O1

vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *
pbrt::ComputeRadicalInversePermutations(uint32_t seed,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *perms;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
  *local_70;
  long *local_68;
  undefined8 uStack_60;
  code *pcStack_58;
  code *pcStack_50;
  _Any_data local_48;
  code *pcStack_38;
  code *pcStack_30;
  polymorphic_allocator<pbrt::DigitPermutation> local_28;
  
  local_28.memoryResource = alloc.memoryResource;
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
  local_70 = (vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
              *)CONCAT44(extraout_var,iVar1);
  (local_70->alloc).memoryResource = local_28.memoryResource;
  local_70->ptr = (DigitPermutation *)0x0;
  local_70->nAlloc = 0;
  local_70->nStored = 0;
  pstd::vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>::
  resize(local_70,1000);
  local_68 = (long *)0x0;
  uStack_60 = 0;
  pcStack_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68 = (long *)operator_new(0x18);
  *local_68 = (long)&local_70;
  local_68[1] = (long)&local_28;
  *(uint32_t *)(local_68 + 2) = seed;
  pcStack_50 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/lowdiscrepancy.cpp:130:36)>
               ::_M_invoke;
  pcStack_58 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/lowdiscrepancy.cpp:130:36)>
               ::_M_manager;
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
               ::_M_invoke;
  pcStack_38 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
               ::_M_manager;
  local_48._M_unused._M_object = &local_68;
  ParallelFor(0,1000,(function<void_(long,_long)> *)&local_48);
  if (pcStack_38 != (code *)0x0) {
    (*pcStack_38)(&local_48,&local_48,__destroy_functor);
  }
  if (pcStack_58 != (code *)0x0) {
    (*pcStack_58)(&local_68,&local_68,3);
  }
  return local_70;
}

Assistant:

pstd::vector<DigitPermutation> *ComputeRadicalInversePermutations(uint32_t seed,
                                                                  Allocator alloc) {
    pstd::vector<DigitPermutation> *perms =
        alloc.new_object<pstd::vector<DigitPermutation>>(alloc);
    perms->resize(PrimeTableSize);
    ParallelFor(0, PrimeTableSize, [&perms, &alloc, seed](int64_t i) {
        (*perms)[i] = DigitPermutation(Primes[i], seed, alloc);
    });
    return perms;
}